

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O3

fio_msg_metadata_s *
websocket_optimize_generic
          (fio_msg_metadata_s *__return_storage_ptr__,fio_str_info_s ch,fio_str_info_s msg,
          uint8_t is_json)

{
  fio_str_info_s msg_00;
  undefined8 in_stack_ffffffffffffffb8;
  uint32_t uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  
  uVar1 = 0;
  uVar2._0_1_ = '\0';
  uVar2._1_1_ = '\0';
  uVar2._2_1_ = '\0';
  uVar2._3_1_ = '\0';
  uVar2._4_1_ = '\0';
  uVar2._5_1_ = '\0';
  uVar2._6_1_ = '\0';
  uVar2._7_1_ = '\0';
  uVar3._0_1_ = '\0';
  uVar3._1_1_ = '\0';
  uVar3._2_1_ = '\0';
  uVar3._3_1_ = '\0';
  if (ch.len < 0x100001) {
    fio_str_utf8_valid((fio_str_s *)&stack0xffffffffffffffc0);
  }
  msg_00.len._0_4_ = uVar1;
  msg_00.capa = in_stack_ffffffffffffffb8;
  msg_00._12_8_ = uVar2;
  msg_00.data._4_1_ = (uint8_t)uVar3;
  msg_00.data._5_1_ = SUB41(uVar3,1);
  msg_00.data._6_1_ = SUB41(uVar3,2);
  msg_00.data._7_1_ = SUB41(uVar3,3);
  websocket_optimize(__return_storage_ptr__,msg_00,(uchar)msg.len);
  __return_storage_ptr__->type_id = -0x20;
  return __return_storage_ptr__;
}

Assistant:

static fio_msg_metadata_s websocket_optimize_generic(fio_str_info_s ch,
                                                     fio_str_info_s msg,
                                                     uint8_t is_json) {
  fio_str_s tmp = FIO_STR_INIT_EXISTING(ch.data, ch.len, 0); // don't free
  tmp.dealloc = NULL;
  unsigned char opcode = 2;
  if (tmp.len <= (2 << 19) && fio_str_utf8_valid(&tmp)) {
    opcode = 1;
  }
  fio_msg_metadata_s ret = websocket_optimize(msg, opcode);
  ret.type_id = WEBSOCKET_OPTIMIZE_PUBSUB;
  return ret;
  (void)ch;
  (void)is_json;
}